

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O2

bool __thiscall llvm::yaml::isBool(yaml *this,StringRef S)

{
  bool bVar1;
  bool bVar2;
  StringRef RHS;
  StringRef RHS_00;
  StringRef RHS_01;
  StringRef RHS_02;
  StringRef RHS_03;
  StringRef RHS_04;
  undefined1 local_20 [8];
  StringRef S_local;
  
  S_local.Data = S.Data;
  RHS.Length = 4;
  RHS.Data = "true";
  local_20 = (undefined1  [8])this;
  bVar1 = StringRef::equals((StringRef *)local_20,RHS);
  bVar2 = true;
  if (!bVar1) {
    RHS_00.Length = 4;
    RHS_00.Data = "True";
    bVar1 = StringRef::equals((StringRef *)local_20,RHS_00);
    if (!bVar1) {
      RHS_01.Length = 4;
      RHS_01.Data = "TRUE";
      bVar1 = StringRef::equals((StringRef *)local_20,RHS_01);
      if (!bVar1) {
        RHS_02.Length = 5;
        RHS_02.Data = "false";
        bVar1 = StringRef::equals((StringRef *)local_20,RHS_02);
        if (!bVar1) {
          RHS_03.Length = 5;
          RHS_03.Data = "False";
          bVar1 = StringRef::equals((StringRef *)local_20,RHS_03);
          if (!bVar1) {
            RHS_04.Length = 5;
            RHS_04.Data = "FALSE";
            bVar2 = StringRef::equals((StringRef *)local_20,RHS_04);
          }
        }
      }
    }
  }
  return bVar2;
}

Assistant:

inline bool isBool(StringRef S) {
  return S.equals("true") || S.equals("True") || S.equals("TRUE") ||
         S.equals("false") || S.equals("False") || S.equals("FALSE");
}